

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_specialspot.cpp
# Opt level: O1

bool __thiscall FSpotList::Add(FSpotList *this,ASpecialSpot *newspot)

{
  long lVar1;
  uint uVar2;
  ASpecialSpot **ppAVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  uVar2 = (this->Spots).Count;
  bVar6 = uVar2 == 0;
  if (!bVar6) {
    ppAVar3 = (this->Spots).Array;
    if (*ppAVar3 != newspot) {
      lVar5 = 0;
      do {
        if (uVar2 - 1 == (int)lVar5) {
          bVar6 = true;
          goto LAB_004be0b3;
        }
        lVar1 = lVar5 + 1;
        lVar4 = lVar5 + 1;
        lVar5 = lVar1;
      } while (ppAVar3[lVar4] != newspot);
      bVar6 = uVar2 <= (uint)lVar1;
    }
    if (bVar6 == false) {
      return false;
    }
  }
LAB_004be0b3:
  TArray<ASpecialSpot_*,_ASpecialSpot_*>::Grow(&this->Spots,1);
  uVar2 = (this->Spots).Count;
  (this->Spots).Array[uVar2] = newspot;
  (this->Spots).Count = uVar2 + 1;
  return bVar6;
}

Assistant:

bool Add(ASpecialSpot *newspot)
	{
		for(unsigned i = 0; i < Spots.Size(); i++)
		{
			if (Spots[i] == newspot) return false;
		}
		Spots.Push(newspot);
		return true;
	}